

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.h
# Opt level: O0

unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
 __thiscall
spvtools::
MakeUnique<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::initializer_list<unsigned_int>>
          (spvtools *this,initializer_list<unsigned_int> *args)

{
  initializer_list<unsigned_int> __l;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  allocator<unsigned_int> local_29;
  iterator local_28;
  size_type local_20;
  initializer_list<unsigned_int> *local_18;
  initializer_list<unsigned_int> *args_local;
  
  local_18 = args;
  args_local = (initializer_list<unsigned_int> *)this;
  this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)::operator_new(0x18);
  local_28 = local_18->_M_array;
  local_20 = local_18->_M_len;
  std::allocator<unsigned_int>::allocator(&local_29);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(this_00,__l,&local_29);
  std::
  unique_ptr<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::default_delete<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::unique_ptr<std::default_delete<std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((unique_ptr<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::default_delete<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)this,this_00);
  std::allocator<unsigned_int>::~allocator(&local_29);
  return (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}